

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

void __thiscall
__gnu_cxx::new_allocator<toml::Value>::construct<toml::Value,toml::Value>
          (new_allocator<toml::Value> *this,Value *__p,Value *__args)

{
  __p->type_ = __args->type_;
  switch(__args->type_) {
  case NULL_TYPE:
  case INT_TYPE:
  case STRING_TYPE:
  case TIME_TYPE:
  case ARRAY_TYPE:
  case TABLE_TYPE:
    __p->field_1 = __args->field_1;
    break;
  case BOOL_TYPE:
    (__p->field_1).bool_ = (__args->field_1).bool_;
    break;
  case DOUBLE_TYPE:
    __p->field_1 = __args->field_1;
    break;
  default:
    __p->type_ = NULL_TYPE;
    (__p->field_1).null_ = (void *)0x0;
  }
  __args->type_ = NULL_TYPE;
  (__args->field_1).null_ = (void *)0x0;
  return;
}

Assistant:

inline Value::Value(Value&& v) noexcept :
    type_(v.type_)
{
    switch (v.type_) {
    case NULL_TYPE: null_ = v.null_; break;
    case BOOL_TYPE: bool_ = v.bool_; break;
    case INT_TYPE: int_ = v.int_; break;
    case DOUBLE_TYPE: double_ = v.double_; break;
    case STRING_TYPE: string_ = v.string_; break;
    case TIME_TYPE: time_ = v.time_; break;
    case ARRAY_TYPE: array_ = v.array_; break;
    case TABLE_TYPE: table_ = v.table_; break;
    default:
        assert(false);
        type_ = NULL_TYPE;
        null_ = nullptr;
    }

    v.type_ = NULL_TYPE;
    v.null_ = nullptr;
}